

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * pushnexttemplate(lua_State *L,char *path)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  char *l;
  char *local_20;
  char *len;
  lua_State *in_stack_fffffffffffffff8;
  
  for (; *in_RSI == ';'; in_RSI = in_RSI + 1) {
  }
  if (*in_RSI == '\0') {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = strchr(in_RSI,0x3b);
    len = in_RSI;
    if (local_20 == (char *)0x0) {
      sVar1 = strlen(in_RSI);
      local_20 = in_RSI + sVar1;
    }
    lua_pushlstring(in_stack_fffffffffffffff8,in_RDI,(size_t)len);
  }
  return local_20;
}

Assistant:

static const char *pushnexttemplate(lua_State *L, const char *path)
{
  const char *l;
  while (*path == *LUA_PATHSEP) path++;  /* skip separators */
  if (*path == '\0') return NULL;  /* no more templates */
  l = strchr(path, *LUA_PATHSEP);  /* find next separator */
  if (l == NULL) l = path + strlen(path);
  lua_pushlstring(L, path, (size_t)(l - path));  /* template */
  return l;
}